

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  char t;
  char p;
  char c;
  int dummy;
  int maxv;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 *local_28;
  int *local_20;
  int *local_18;
  int local_4;
  
  local_18 = in_RSI;
  if (in_RSI == (int *)0x0) {
    local_18 = (int *)&stack0xffffffffffffffd0;
  }
  local_20 = in_RDX;
  if (in_RDX == (int *)0x0) {
    local_20 = (int *)&stack0xffffffffffffffd0;
  }
  local_28 = in_RCX;
  if (in_RCX == (undefined4 *)0x0) {
    local_28 = (undefined4 *)&stack0xffffffffffffffd0;
  }
  stbi__rewind(in_RDI);
  sVar1 = stbi__get8((stbi__context *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(in_stack_ffffffffffffffce,
                                       CONCAT15(in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8)
                                      )));
  sVar2 = stbi__get8((stbi__context *)
                     CONCAT17(in_stack_ffffffffffffffcf,
                              CONCAT16(sVar1,CONCAT15(in_stack_ffffffffffffffcd,
                                                      in_stack_ffffffffffffffc8))));
  if ((sVar1 == 'P') && ((sVar2 == '5' || (sVar2 == '6')))) {
    uVar5 = 1;
    if (sVar2 == '6') {
      uVar5 = 3;
    }
    *local_28 = uVar5;
    sVar3 = stbi__get8((stbi__context *)
                       CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(0x50,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    stbi__pnm_skip_whitespace
              ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    iVar4 = stbi__pnm_getinteger
                      ((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,
                                                  in_stack_ffffffffffffffc8))));
    *local_18 = iVar4;
    stbi__pnm_skip_whitespace
              ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    iVar4 = stbi__pnm_getinteger
                      ((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,
                                                  in_stack_ffffffffffffffc8))));
    *local_20 = iVar4;
    stbi__pnm_skip_whitespace
              ((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,in_stack_ffffffffffffffc8))));
    iVar4 = stbi__pnm_getinteger
                      ((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (char *)CONCAT17(sVar3,CONCAT16(sVar1,CONCAT15(sVar2,
                                                  in_stack_ffffffffffffffc8))));
    if (iVar4 < 0x100) {
      local_4 = 1;
    }
    else {
      local_4 = stbi__err("max value > 255");
    }
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}